

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::ParallelWorkFunc<0u>(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  CollectionState CVar3;
  undefined4 *puVar4;
  MarkContext *markContext;
  Recycler *this_local;
  
  CVar3 = ObservableValue::operator_cast_to_CollectionState
                    ((ObservableValue *)&this->collectionState);
  if (CVar3 == CollectionStateParallelMark) {
    ProcessParallelMark(this,false,&this->parallelMarkContext2);
  }
  else if (CVar3 == CollectionStateBackgroundParallelMark) {
    ProcessParallelMark(this,true,&this->parallelMarkContext2);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1b23,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return;
}

Assistant:

void
Recycler::ParallelWorkFunc()
{
    Assert(parallelId == 0 || parallelId == 1);

    MarkContext * markContext = (parallelId == 0 ? &this->parallelMarkContext2 : &this->parallelMarkContext3);

    switch (this->collectionState)
    {
        case CollectionStateParallelMark:
            this->ProcessParallelMark(false, markContext);
            break;

        case CollectionStateBackgroundParallelMark:
            this->ProcessParallelMark(true, markContext);
            break;

        default:
            Assert(false);
    }
}